

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

Aig_Obj_t * Dar_LibBuildBest(Dar_Man_t *p)

{
  Dar_Lib_t *pDVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  long lVar4;
  long lVar5;
  int Counter;
  int local_1c;
  
  local_1c = 4;
  lVar5 = 0;
  for (lVar4 = 0; pDVar1 = s_DarLib, lVar4 < p->vLeavesBest->nSize; lVar4 = lVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p->vLeavesBest,(int)lVar4);
    *(void **)(s_DarLib->pDatas->nLats + lVar5 + -0x15) = pvVar2;
    lVar5 = lVar5 + 0x18;
  }
  Dar_LibBuildClear_rec(s_DarLib->pObjs + p->OutBest,&local_1c);
  pAVar3 = Dar_LibBuildBest_rec(p,pDVar1->pObjs + p->OutBest);
  return pAVar3;
}

Assistant:

Aig_Obj_t * Dar_LibBuildBest( Dar_Man_t * p )
{
    int i, Counter = 4;
    for ( i = 0; i < Vec_PtrSize(p->vLeavesBest); i++ )
        s_DarLib->pDatas[i].pFunc = (Aig_Obj_t *)Vec_PtrEntry( p->vLeavesBest, i );
    Dar_LibBuildClear_rec( Dar_LibObj(s_DarLib, p->OutBest), &Counter );
    return Dar_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, p->OutBest) );
}